

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void jtalkdll_copyright(void)

{
  fprintf(_stderr,"%s, Open JTalk Dynamic Link Libraries \n","jtalkdll");
  fprintf(_stderr,"version %d.%d.%d revision(%s)\n",0,0,0x43,"6437128");
  fprintf(_stderr,"https://github.com/rosmarinus/jtalkdll.git\n");
  fprintf(_stderr,"Copyright (C) 2020 takayan\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  Open_JTalk_COPYRIGHT();
  fprintf(_stderr,"PortAudio Portable Real-Time Audio Library\n");
  fprintf(_stderr,"Copyright (c) 1999-2011 Ross Bencina and Phil Burk\n");
  fprintf(_stderr,"http://www.portaudio.com/\n");
  fprintf(_stderr,"\n");
  return;
}

Assistant:

OPENJTALK_CONVENTION jtalkdll_copyright()
{
	fprintf(stderr, u8"%s, Open JTalk Dynamic Link Libraries \n", DLL_NAME);
	if (strlen(GIT_REV))
	{
		fprintf(stderr, u8"version %d.%d.%d revision(%s)\n", VER_MAJOR, VER_MINOR, VER_BUILD, GIT_REV);
	}
	else
	{
		fprintf(stderr, u8"version %d.%d.%d\n", VER_MAJOR, VER_MINOR, VER_BUILD);
	}
	fprintf(stderr, u8"https://github.com/rosmarinus/jtalkdll.git\n");
	fprintf(stderr, u8"Copyright (C) 2020 takayan\n");
	fprintf(stderr, u8"All rights reserved.\n");
	fprintf(stderr, u8"\n");
	Open_JTalk_COPYRIGHT();

	// portaudio
	fprintf(stderr, u8"PortAudio Portable Real-Time Audio Library\n");
	fprintf(stderr, u8"Copyright (c) 1999-2011 Ross Bencina and Phil Burk\n");
	fprintf(stderr, u8"http://www.portaudio.com/\n");
	fprintf(stderr, u8"\n");
}